

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O0

pair<int,_int> __thiscall
mp::VecReader<std::pair<int,_int>_>::ReadNext(VecReader<std::pair<int,_int>_> *this)

{
  NLW2_SOLReadResultCode NVar1;
  long in_RDI;
  string *unaff_retaddr;
  pair<int,_int> v;
  FILE *in_stack_00000018;
  pair<int,_int> local_8;
  
  std::pair<int,_int>::pair<int,_int,_true>(&local_8);
  *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + -1;
  NVar1 = Read<int>(in_stack_00000018,v.second,(pair<int,_int> *)this,unaff_retaddr);
  *(NLW2_SOLReadResultCode *)(in_RDI + 0x10) = NVar1;
  if (NVar1 != NLW2_SOLRead_OK) {
    *(undefined4 *)(in_RDI + 0xc) = 0;
  }
  return local_8;
}

Assistant:

Value VecReader<Value>::ReadNext() {
  Value v;
  --n_;                // decrement counter
  assert(n_ >= 0);
  if (NLW2_SOLRead_OK !=
      (rr_ = Read(f_, binary_, v, err_msg_))) {
    n_ = 0;            // return error status
  }
  return v;
}